

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

archive_string_conv * get_sconv_object(archive *a,char *fc,char *tc,wchar_t flag)

{
  archive_string_conv *paVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  char *__s;
  char *__s_00;
  archive_string_conv *paVar5;
  char *__ptr;
  char *pcVar6;
  iconv_t pvVar7;
  archive_string_conv *paVar8;
  bool bVar9;
  uint local_44;
  
  if (a == (archive *)0x0) {
    local_44 = 0xffffffff;
  }
  else {
    for (paVar5 = a->sconv; paVar5 != (archive_string_conv *)0x0; paVar5 = paVar5->next) {
      iVar3 = strcmp(paVar5->from_charset,fc);
      if ((iVar3 == 0) && (iVar3 = strcmp(paVar5->to_charset,tc), iVar3 == 0)) {
        return paVar5;
      }
    }
    local_44 = a->current_codepage;
  }
  __s = canonical_charset_name(fc);
  __s_00 = canonical_charset_name(tc);
  paVar5 = (archive_string_conv *)calloc(1,0x68);
  if (paVar5 != (archive_string_conv *)0x0) {
    __ptr = strdup(__s);
    paVar5->from_charset = __ptr;
    if (__ptr != (char *)0x0) {
      pcVar6 = strdup(__s_00);
      paVar5->to_charset = pcVar6;
      if (pcVar6 != (char *)0x0) {
        if ((flag & 1U) == 0) {
          wVar4 = L'\x01';
          if ((flag & 2U) == 0) goto LAB_0010cefe;
          paVar5->to_cp = local_44;
          paVar5->from_cp = 0xffffffff;
          bVar9 = false;
        }
        else {
          paVar5->from_cp = local_44;
          paVar5->to_cp = 0xffffffff;
          bVar9 = local_44 != 0xffffffff;
        }
        iVar3 = strcmp(__s,__s_00);
        if (iVar3 == 0) {
          wVar4 = L'\x01';
        }
        else {
          wVar4 = (wchar_t)(byte)(local_44 == 0xffffffff & bVar9);
        }
LAB_0010cefe:
        paVar5->same = wVar4;
        iVar3 = strcmp(__s_00,"UTF-8");
        if (iVar3 == 0) {
          wVar4 = flag | 0x100;
        }
        else {
          iVar3 = strcmp(__s_00,"UTF-16BE");
          if (iVar3 == 0) {
            wVar4 = flag | 0x400;
          }
          else {
            iVar3 = strcmp(__s_00,"UTF-16LE");
            wVar4 = flag | 0x1000;
            if (iVar3 != 0) {
              wVar4 = flag;
            }
          }
        }
        iVar3 = strcmp(__s,"UTF-8");
        if (iVar3 == 0) {
          wVar4 = wVar4 | 0x200;
        }
        else {
          iVar3 = strcmp(__s,"UTF-16BE");
          if (iVar3 == 0) {
            wVar4 = wVar4 | 0x800;
          }
          else {
            iVar3 = strcmp(__s,"UTF-16LE");
            if (iVar3 == 0) {
              wVar4 = wVar4 | 0x2000;
            }
          }
        }
        wVar2 = wVar4 | 0x40;
        if ((wVar4 & 0x2a00U) == 0) {
          wVar2 = wVar4;
        }
        if ((wVar4 & 2U) == 0) {
          wVar2 = wVar4;
        }
        paVar5->cd_w = (iconv_t)0xffffffffffffffff;
        pvVar7 = (iconv_t)0xffffffffffffffff;
        if (((wVar2 & 8U) == 0) && ((wVar2 & 0x1500U) == 0 || (wVar2 & 0x2a00U) == 0)) {
          pvVar7 = iconv_open(__s_00,__s);
        }
        paVar5->cd = pvVar7;
        paVar5->flag = wVar2;
        setup_converter(paVar5);
        if (paVar5->nconverter == L'\0') {
          if (a != (archive *)0x0) {
            if ((flag & 1U) == 0) {
              tc = fc;
            }
            archive_set_error(a,-1,"iconv_open failed : Cannot handle ``%s\'\'",tc);
          }
          free_sconv_object(paVar5);
          return (archive_string_conv *)0x0;
        }
        if (a != (archive *)0x0) {
          paVar1 = (archive_string_conv *)&a->sconv;
          do {
            paVar8 = paVar1;
            paVar1 = paVar8->next;
          } while (paVar1 != (archive_string_conv *)0x0);
          paVar8->next = paVar5;
          return paVar5;
        }
        return paVar5;
      }
      free(__ptr);
    }
    free(paVar5);
  }
  if (a == (archive *)0x0) {
    return (archive_string_conv *)0x0;
  }
  archive_set_error(a,0xc,"Could not allocate memory for a string conversion object");
  return (archive_string_conv *)0x0;
}

Assistant:

static struct archive_string_conv *
get_sconv_object(struct archive *a, const char *fc, const char *tc, int flag)
{
	struct archive_string_conv *sc;
	unsigned current_codepage;

	/* Check if we have made the sconv object. */
	sc = find_sconv_object(a, fc, tc);
	if (sc != NULL)
		return (sc);

	if (a == NULL)
		current_codepage = get_current_codepage();
	else
		current_codepage = a->current_codepage;

	sc = create_sconv_object(canonical_charset_name(fc),
	    canonical_charset_name(tc), current_codepage, flag);
	if (sc == NULL) {
		if (a != NULL)
			archive_set_error(a, ENOMEM,
			    "Could not allocate memory for "
			    "a string conversion object");
		return (NULL);
	}

	/*
	 * If there is no converter for current string conversion object,
	 * we cannot handle this conversion.
	 */
	if (sc->nconverter == 0) {
		if (a != NULL) {
#if HAVE_ICONV
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "iconv_open failed : Cannot handle ``%s''",
			    (flag & SCONV_TO_CHARSET)?tc:fc);
#else
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "A character-set conversion not fully supported "
			    "on this platform");
#endif
		}
		/* Failed; free a sconv object. */
		free_sconv_object(sc);
		return (NULL);
	}

	/*
	 * Success!
	 */
	if (a != NULL)
		add_sconv_object(a, sc);
	return (sc);
}